

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_function_list.cpp
# Opt level: O0

void __thiscall ON_FunctionList::~ON_FunctionList(ON_FunctionList *this)

{
  bool bVar1;
  char cVar2;
  int dtor_error;
  int dtor_lock_value;
  ON_FunctionList *this_local;
  
  bVar1 = ON_Lock::GetLock(&this->m_lock,0x56);
  cVar2 = !bVar1;
  this->m_head = (void *)0x0;
  this->m_tail = (void *)0x0;
  ON_FixedSizePool::Destroy(&this->m_fsp);
  bVar1 = ON_Lock::ReturnLock(&this->m_lock,0x56);
  if (!bVar1) {
    cVar2 = cVar2 + '\x02';
    ON_Lock::BreakLock(&this->m_lock);
  }
  if (cVar2 != '\0') {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_function_list.cpp"
               ,0x39,"",
               "Destroying a locked list - multiple delete or multiple delete or multiple exists.");
  }
  ON_FixedSizePool::~ON_FixedSizePool(&this->m_fsp);
  return;
}

Assistant:

ON_FunctionList::~ON_FunctionList()
{
  // The return value of m_lock.GetDefaultLock() is intentionally ignored
  // because this is a destructor.
  const int dtor_lock_value = 86;
  int dtor_error = 0;
  if (false == m_lock.GetLock(dtor_lock_value))
    dtor_error = 1;
  m_head=nullptr;
  m_tail=nullptr;
  m_fsp.Destroy();
  if (false == m_lock.ReturnLock(dtor_lock_value))
  {
    dtor_error += 2;
    m_lock.BreakLock();
  }
  if (dtor_error > 0 )
  {
    ON_ERROR("Destroying a locked list - multiple delete or multiple delete or multiple exists.");
  }
}